

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

size_t __thiscall
spvtools::opt::analysis::TensorViewNV::ComputeExtraStateHash
          (TensorViewNV *this,size_t hash,SeenTypes *param_2)

{
  size_t sVar1;
  
  sVar1 = utils::
          hash_combine<unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (hash,(uint *)&(this->super_Type).field_0x24,&this->has_dimensions_id_,
                     &this->perm_);
  return sVar1;
}

Assistant:

size_t TensorViewNV::ComputeExtraStateHash(size_t hash, SeenTypes*) const {
  return hash_combine(hash, dim_id_, has_dimensions_id_, perm_);
}